

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t sse42_despace_to(char *bytes,size_t howmany,char *out)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 (*pauVar4) [16];
  uint in_ECX;
  char c;
  int result;
  __m128i x;
  ulong local_90;
  size_t i;
  __m128i targetchars;
  size_t local_70;
  size_t pos;
  char *out_local;
  size_t howmany_local;
  char *bytes_local;
  
  local_70 = 0;
  auVar2 = vpinsrb_avx(ZEXT116(0x20),0xd,1);
  auVar2 = vpinsrb_avx(auVar2,10,2);
  auVar2 = vpinsrb_avx(auVar2,0x20,3);
  auVar2 = vpinsrb_avx(auVar2,0x20,4);
  auVar2 = vpinsrb_avx(auVar2,0xd,5);
  auVar2 = vpinsrb_avx(auVar2,10,6);
  auVar2 = vpinsrb_avx(auVar2,0x20,7);
  auVar2 = vpinsrb_avx(auVar2,0x20,8);
  auVar2 = vpinsrb_avx(auVar2,0xd,9);
  auVar2 = vpinsrb_avx(auVar2,10,10);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xd);
  auVar2 = vpinsrb_avx(auVar2,10,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xf);
  local_90 = 0;
  while (local_90 + 0xf < howmany) {
    pauVar4 = (undefined1 (*) [16])(bytes + local_90);
    uVar3 = *(undefined8 *)(*pauVar4 + 8);
    vpcmpestri_avx(auVar2,*pauVar4,0);
    local_90 = (long)(int)(in_ECX + ((int)in_ECX < 0x10)) + local_90;
    *(undefined8 *)(out + local_70) = *(undefined8 *)*pauVar4;
    *(undefined8 *)(out + local_70 + 8) = uVar3;
    local_70 = (long)(int)in_ECX + local_70;
    in_ECX = (uint)((int)in_ECX < 0x10);
  }
  for (; local_90 < howmany; local_90 = local_90 + 1) {
    cVar1 = bytes[local_90];
    if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
      out[local_70] = cVar1;
      local_70 = local_70 + 1;
    }
  }
  return local_70;
}

Assistant:

size_t sse42_despace_to(const char *restrict bytes,
                                      size_t howmany, char *restrict out) {
  size_t pos = 0;
  __m128i targetchars =
      _mm_set_epi8(' ', '\n', '\r', ' ', ' ', '\n', '\r', ' ', ' ', '\n', '\r',
                   ' ', ' ', '\n', '\r', ' ');
  size_t i = 0;
  for (; i + 15 < howmany;) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int result =
        _mm_cmpestri(targetchars, 3, x, 16,
                     _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
    i += result + (result < 16);
    _mm_storeu_si128((__m128i *)(out + pos), x);
    pos += result;
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    out[pos++] = c;
  }
  return pos;
}